

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ResolvedConfig * __thiscall
slang::BumpAllocator::emplace<slang::ast::ResolvedConfig,slang::ast::ResolvedConfig_const&>
          (BumpAllocator *this,ResolvedConfig *args)

{
  InstanceSymbol *pIVar1;
  pointer ppSVar2;
  size_t sVar3;
  ResolvedConfig *pRVar4;
  
  pRVar4 = (ResolvedConfig *)allocate(this,0x28,8);
  pIVar1 = args->rootInstance;
  ppSVar2 = (args->liblist)._M_ptr;
  sVar3 = (args->liblist)._M_extent._M_extent_value;
  pRVar4->useConfig = args->useConfig;
  pRVar4->rootInstance = pIVar1;
  (pRVar4->liblist)._M_ptr = ppSVar2;
  (pRVar4->liblist)._M_extent._M_extent_value = sVar3;
  pRVar4->configRule = args->configRule;
  return pRVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }